

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  char (*in_R8) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  format::string<std::__cxx11::string,char_const[9],char_const(&)[6],char_const(&)[6]>
            (&local_28,(format *)"{1} {0}!",(char (*) [9])"world",(char (*) [6])"hello",in_R8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_28._M_dataplus._M_p,local_28._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {
  std::cout << format::string("{1} {0}!", "world", "hello") << "\n";
}